

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureCompletenessTests::init
          (TextureCompletenessTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int iVar2;
  int y;
  int extraout_EAX;
  TestNode *pTVar3;
  Incomplete2DSizeCase *pIVar4;
  RenderContext *pRVar5;
  ContextInfo *pCVar6;
  Incomplete2DFormatCase *pIVar7;
  Incomplete2DMissingLevelCase *pIVar8;
  Incomplete2DWrapModeCase *pIVar9;
  TestNode *pTVar10;
  IncompleteCubeSizeCase *pIVar11;
  IncompleteCubeFormatCase *pIVar12;
  IncompleteCubeMissingLevelCase *pIVar13;
  IncompleteCubeWrapModeCase *pIVar14;
  Vector<int,_2> local_1b8;
  Vector<int,_2> local_1b0;
  Vector<int,_2> local_1a8;
  Vector<int,_2> local_1a0;
  Vector<int,_2> local_198;
  Vector<int,_2> local_190;
  Vector<int,_2> local_188;
  Vector<int,_2> local_180;
  Vector<int,_2> local_178;
  Vector<int,_2> local_170;
  Vector<int,_2> local_168;
  Vector<int,_2> local_160;
  Vector<int,_2> local_158;
  Vector<int,_2> local_150;
  Vector<int,_2> local_148;
  Vector<int,_2> local_140;
  Vector<int,_2> local_138;
  Vector<int,_2> local_130;
  Vector<int,_2> local_128;
  Vector<int,_2> local_120;
  Vector<int,_2> local_118;
  Vector<int,_2> local_110;
  Vector<int,_2> local_108;
  Vector<int,_2> local_100;
  Vector<int,_2> local_f8;
  Vector<int,_2> local_f0;
  Vector<int,_2> local_e8;
  Vector<int,_2> local_e0;
  Vector<int,_2> local_d8;
  Vector<int,_2> local_d0;
  Vector<int,_2> local_c8;
  Vector<int,_2> local_c0;
  Vector<int,_2> local_b8;
  Vector<int,_2> local_b0;
  Vector<int,_2> local_a8;
  Vector<int,_2> local_a0;
  Vector<int,_2> local_98;
  Vector<int,_2> local_90;
  Vector<int,_2> local_88;
  Vector<int,_2> local_80;
  Vector<int,_2> local_78;
  Vector<int,_2> local_70;
  Vector<int,_2> local_68;
  Vector<int,_2> local_60;
  Vector<int,_2> local_58;
  Vector<int,_2> local_50;
  Vector<int,_2> local_48;
  Vector<int,_2> local_40;
  Vector<int,_2> local_38;
  TestNode *local_30;
  TestCaseGroup *cube;
  TestNode *local_18;
  TestCaseGroup *tex2d;
  TextureCompletenessTests *this_local;
  
  tex2d = (TestCaseGroup *)this;
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D completeness");
  local_18 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cubemap completeness");
  local_30 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = local_18;
  pIVar4 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_38,0xff,0xff);
  tcu::Vector<int,_2>::Vector(&local_40,0xff,0xff);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar4,pTVar1,pRVar5,"npot_size","",&local_38,&local_40,0,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar4);
  pTVar3 = local_18;
  pIVar4 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_48,0x100,0x100);
  tcu::Vector<int,_2>::Vector(&local_50,0xff,0xff);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar4,pTVar1,pRVar5,"npot_size_level_0","",&local_48,&local_50,0,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar4);
  pTVar3 = local_18;
  pIVar4 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_58,0x100,0x100);
  tcu::Vector<int,_2>::Vector(&local_60,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar4,pTVar1,pRVar5,"npot_size_level_1","",&local_58,&local_60,1,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar4);
  pTVar3 = local_18;
  pIVar4 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_68,0x100,0x100);
  tcu::Vector<int,_2>::Vector(&local_70,0,0);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar4,pTVar1,pRVar5,"not_positive_level_0","",&local_68,&local_70,0,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar4);
  pTVar3 = local_18;
  pIVar7 = (Incomplete2DFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_78,0x80,0x80);
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar7,pTVar1,pRVar5,"format_mismatch_rgb_rgba","",&local_78,0x1907,0x1908,1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar7);
  pTVar3 = local_18;
  pIVar7 = (Incomplete2DFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_80,0x80,0x80);
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar7,pTVar1,pRVar5,"format_mismatch_rgba_rgb","",&local_80,0x1908,0x1907,1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar7);
  pTVar3 = local_18;
  pIVar7 = (Incomplete2DFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_88,0x80,0x80);
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar7,pTVar1,pRVar5,"format_mismatch_luminance_luminance_alpha","",&local_88,0x1909,
             0x190a,1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar7);
  pTVar3 = local_18;
  pIVar7 = (Incomplete2DFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_90,0x80,0x80);
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar7,pTVar1,pRVar5,"format_mismatch_luminance_alpha_luminance","",&local_90,0x190a,
             0x1909,1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar7);
  pTVar3 = local_18;
  pIVar8 = (Incomplete2DMissingLevelCase *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_98,0x80,0x80);
  Incomplete2DMissingLevelCase::Incomplete2DMissingLevelCase
            (pIVar8,pTVar1,pRVar5,"missing_level_1","",&local_98,1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar8);
  pTVar3 = local_18;
  pIVar8 = (Incomplete2DMissingLevelCase *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_a0,0x80,0x80);
  Incomplete2DMissingLevelCase::Incomplete2DMissingLevelCase
            (pIVar8,pTVar1,pRVar5,"missing_level_3","",&local_a0,3);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar8);
  pTVar3 = local_18;
  pIVar8 = (Incomplete2DMissingLevelCase *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_a8,0x80,0x40);
  iVar2 = ::deLog2Floor32(0x80);
  y = ::deLog2Floor32(0x40);
  iVar2 = de::max<int>(iVar2,y);
  Incomplete2DMissingLevelCase::Incomplete2DMissingLevelCase
            (pIVar8,pTVar1,pRVar5,"last_level_missing","",&local_a8,iVar2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar8);
  pTVar3 = local_18;
  pIVar9 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_b0,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar9,pTVar1,pRVar5,"npot_t_repeat","",&local_b0,0x812f,0x2901,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  pTVar3 = local_18;
  pIVar9 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_b8,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar9,pTVar1,pRVar5,"npot_s_repeat","",&local_b8,0x2901,0x812f,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  pTVar3 = local_18;
  pIVar9 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_c0,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar9,pTVar1,pRVar5,"npot_all_repeat","",&local_c0,0x2901,0x2901,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  pTVar3 = local_18;
  pIVar9 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_c8,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar9,pTVar1,pRVar5,"npot_mirrored_repeat","",&local_c8,0x8370,0x8370,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  pTVar3 = local_18;
  pIVar9 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_d0,0x7f,0x80);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar9,pTVar1,pRVar5,"repeat_width_npot","",&local_d0,0x2901,0x2901,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  pTVar3 = local_18;
  pIVar9 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_d8,0x80,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar9,pTVar1,pRVar5,"repeat_height_npot","",&local_d8,0x2901,0x2901,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  pTVar3 = local_18;
  pTVar10 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_e0,0x40,0x40);
  Complete2DExtraLevelCase::Complete2DExtraLevelCase
            ((Complete2DExtraLevelCase *)pTVar10,pTVar1,pRVar5,"extra_level","",&local_e0);
  tcu::TestNode::addChild(pTVar3,pTVar10);
  pTVar3 = local_18;
  pTVar10 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_e8,0x40,0x40);
  Incomplete2DEmptyObjectCase::Incomplete2DEmptyObjectCase
            ((Incomplete2DEmptyObjectCase *)pTVar10,pTVar1,pRVar5,"empty_object","",&local_e8);
  tcu::TestNode::addChild(pTVar3,pTVar10);
  pTVar3 = local_30;
  pIVar11 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_f0,0x40,0x40);
  tcu::Vector<int,_2>::Vector(&local_f8,0x3f,0x3f);
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar11,pTVar1,pRVar5,"npot_size_level_0","",&local_f0,&local_f8,0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar11);
  pTVar3 = local_30;
  pIVar11 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_100,0x40,0x40);
  tcu::Vector<int,_2>::Vector(&local_108,0x1f,0x1f);
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar11,pTVar1,pRVar5,"npot_size_level_1","",&local_100,&local_108,1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar11);
  pTVar3 = local_30;
  pIVar11 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_110,0x40,0x40);
  tcu::Vector<int,_2>::Vector(&local_118,0x3f,0x3f);
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar11,pTVar1,pRVar5,"npot_size_level_0_pos_x","",&local_110,&local_118,0,
             CUBEFACE_POSITIVE_X);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar11);
  pTVar3 = local_30;
  pIVar11 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_120,0x40,0x40);
  tcu::Vector<int,_2>::Vector(&local_128,0x1f,0x1f);
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar11,pTVar1,pRVar5,"npot_size_level_1_neg_x","",&local_120,&local_128,1,
             CUBEFACE_NEGATIVE_X);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar11);
  pTVar3 = local_30;
  pIVar11 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_130,0x40,0x40);
  tcu::Vector<int,_2>::Vector(&local_138,0,0);
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar11,pTVar1,pRVar5,"not_positive_level_0","",&local_130,&local_138,0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar11);
  pTVar3 = local_30;
  pIVar12 = (IncompleteCubeFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_140,0x40,0x40);
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar12,pTVar1,pRVar5,"format_mismatch_rgb_rgba_level_0","",&local_140,0x1907,0x1908);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar12);
  pTVar3 = local_30;
  pIVar12 = (IncompleteCubeFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_148,0x40,0x40);
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar12,pTVar1,pRVar5,"format_mismatch_rgba_rgb_level_0","",&local_148,0x1908,0x1907);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar12);
  pTVar3 = local_30;
  pIVar12 = (IncompleteCubeFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_150,0x40,0x40);
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar12,pTVar1,pRVar5,"format_mismatch_luminance_luminance_alpha_level_0","",&local_150
             ,0x1909,0x190a);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar12);
  pTVar3 = local_30;
  pIVar12 = (IncompleteCubeFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_158,0x40,0x40);
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar12,pTVar1,pRVar5,"format_mismatch_luminance_alpha_luminance_level_0","",&local_158
             ,0x190a,0x1909);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar12);
  pTVar3 = local_30;
  pIVar12 = (IncompleteCubeFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_160,0x40,0x40);
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar12,pTVar1,pRVar5,"format_mismatch_rgb_rgba_level_0_pos_z","",&local_160,0x1907,
             0x1908,CUBEFACE_POSITIVE_Z);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar12);
  pTVar3 = local_30;
  pIVar12 = (IncompleteCubeFormatCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_168,0x40,0x40);
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar12,pTVar1,pRVar5,"format_mismatch_rgba_rgb_level_0_neg_z","",&local_168,0x1908,
             0x1907,CUBEFACE_NEGATIVE_Z);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar12);
  pTVar3 = local_30;
  pIVar13 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_170,0x40,0x40);
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar13,pTVar1,pRVar5,"missing_level_1","",&local_170,1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar13);
  pTVar3 = local_30;
  pIVar13 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_178,0x40,0x40);
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar13,pTVar1,pRVar5,"missing_level_3","",&local_178,3);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar13);
  pTVar3 = local_30;
  pIVar13 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_180,0x40,0x40);
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar13,pTVar1,pRVar5,"missing_level_1_pos_y","",&local_180,1,CUBEFACE_POSITIVE_Y);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar13);
  pTVar3 = local_30;
  pIVar13 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_188,0x40,0x40);
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar13,pTVar1,pRVar5,"missing_level_3_neg_y","",&local_188,3,CUBEFACE_NEGATIVE_Y);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar13);
  pTVar3 = local_30;
  pIVar14 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_190,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar14,pTVar1,pRVar5,"npot_t_repeat","",&local_190,0x812f,0x2901,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar14);
  pTVar3 = local_30;
  pIVar14 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_198,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar14,pTVar1,pRVar5,"npot_s_repeat","",&local_198,0x2901,0x812f,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar14);
  pTVar3 = local_30;
  pIVar14 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_1a0,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar14,pTVar1,pRVar5,"npot_all_repeat","",&local_1a0,0x2901,0x2901,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar14);
  pTVar3 = local_30;
  pIVar14 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_1a8,0x7f,0x7f);
  pCVar6 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar14,pTVar1,pRVar5,"npot_mirrored_repeat","",&local_1a8,0x8370,0x8370,pCVar6);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar14);
  pTVar3 = local_30;
  pTVar10 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_1b0,0x40,0x40);
  CompleteCubeExtraLevelCase::CompleteCubeExtraLevelCase
            ((CompleteCubeExtraLevelCase *)pTVar10,pTVar1,pRVar5,"extra_level","",&local_1b0);
  tcu::TestNode::addChild(pTVar3,pTVar10);
  pTVar3 = local_30;
  pTVar10 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  tcu::Vector<int,_2>::Vector(&local_1b8,0x40,0x40);
  IncompleteCubeEmptyObjectCase::IncompleteCubeEmptyObjectCase
            ((IncompleteCubeEmptyObjectCase *)pTVar10,pTVar1,pRVar5,"empty_object","",&local_1b8);
  tcu::TestNode::addChild(pTVar3,pTVar10);
  return extraout_EAX;
}

Assistant:

void TextureCompletenessTests::init (void)
{
	tcu::TestCaseGroup* tex2d = new tcu::TestCaseGroup(m_testCtx, "2d", "2D completeness");
	addChild(tex2d);
	tcu::TestCaseGroup* cube = new tcu::TestCaseGroup(m_testCtx, "cube", "Cubemap completeness");
	addChild(cube);

	// Texture 2D size.
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size",				"", IVec2(255, 255), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",		"", IVec2(256, 256), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",		"", IVec2(256, 256), IVec2(127, 127), 1, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",	"", IVec2(256, 256), IVec2(0, 0),	  0, m_context.getContextInfo()));
	// Texture 2D format.
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba",						"", IVec2(128, 128), GL_RGB,				GL_RGBA,			1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb",						"", IVec2(128, 128), GL_RGBA,				GL_RGB,				1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha",	"", IVec2(128, 128), GL_LUMINANCE,			GL_LUMINANCE_ALPHA,	1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance",	"", IVec2(128, 128), GL_LUMINANCE_ALPHA,	GL_LUMINANCE,		1));
	// Texture 2D missing level.
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",			"", IVec2(128, 128),	1));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",			"", IVec2(128, 128),	3));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "last_level_missing",			"", IVec2(128, 64),		de::max(deLog2Floor32(128), deLog2Floor32(64))));
	// Texture 2D wrap modes.
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_width_npot",		"", IVec2(127, 128), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_height_npot",		"", IVec2(128, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	// Texture 2D extra level.
	tex2d->addChild(new Complete2DExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Texture 2D empty object.
	tex2d->addChild(new Incomplete2DEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));

	// Cube size.
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",			"", IVec2(64, 64), IVec2(63, 63), 0));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",			"", IVec2(64, 64), IVec2(31, 31), 1));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0_pos_x",	"", IVec2(64, 64), IVec2(63, 63), 0, tcu::CUBEFACE_POSITIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1_neg_x",	"", IVec2(64, 64), IVec2(31, 31), 1, tcu::CUBEFACE_NEGATIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",		"", IVec2(64, 64), IVec2(0,0)	, 0));
	// Cube format.
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0",					"", IVec2(64, 64), GL_RGB,				GL_RGBA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0",					"", IVec2(64, 64), GL_RGBA,				GL_RGB));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha_level_0",	"", IVec2(64, 64), GL_LUMINANCE,		GL_LUMINANCE_ALPHA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance_level_0",	"", IVec2(64, 64), GL_LUMINANCE_ALPHA,	GL_LUMINANCE));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0_pos_z",				"", IVec2(64, 64), GL_RGB,				GL_RGBA,	tcu::CUBEFACE_POSITIVE_Z));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0_neg_z",				"", IVec2(64, 64), GL_RGBA,				GL_RGB,		tcu::CUBEFACE_NEGATIVE_Z));
	// Cube missing level.
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",		"", IVec2(64, 64), 1));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",		"", IVec2(64, 64), 3));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1_pos_y",	"", IVec2(64, 64), 1, tcu::CUBEFACE_POSITIVE_Y));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3_neg_y",	"", IVec2(64, 64), 3, tcu::CUBEFACE_NEGATIVE_Y));
	// Cube wrap modes.
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	// Cube extra level.
	cube->addChild(new CompleteCubeExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Cube extra level.
	cube->addChild(new IncompleteCubeEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));
}